

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O3

ChVector<double> *
chrono::Q_to_NasaAngles(ChVector<double> *__return_storage_ptr__,ChQuaternion<double> *q1)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  dVar9 = q1->m_data[0];
  dVar1 = q1->m_data[1];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar1;
  dVar2 = q1->m_data[2];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar2;
  dVar3 = q1->m_data[3];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar9 * dVar3;
  auVar4 = vfmadd231sd_fma(auVar10,auVar13,auVar16);
  dVar8 = atan2(auVar4._0_8_ + auVar4._0_8_,
                dVar9 * dVar9 + ((dVar1 * dVar1 - dVar2 * dVar2) - dVar3 * dVar3));
  __return_storage_ptr__->m_data[2] = dVar8;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = q1->m_data[2];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = q1->m_data[3];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = q1->m_data[1] * q1->m_data[0];
  auVar4 = vfmadd231sd_fma(auVar11,auVar14,auVar4);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar1 * dVar1;
  auVar5._8_8_ = 0x8000000000000000;
  auVar5._0_8_ = 0x8000000000000000;
  auVar7 = vxorpd_avx512vl(auVar6,auVar5);
  dVar9 = atan2(auVar4._0_8_ + auVar4._0_8_,
                (auVar7._0_8_ - dVar2 * dVar2) + dVar3 * dVar3 + dVar9 * dVar9);
  __return_storage_ptr__->m_data[1] = dVar9;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = q1->m_data[1];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = q1->m_data[3];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = q1->m_data[0] * q1->m_data[2];
  auVar4 = vfmsub231sd_fma(auVar12,auVar15,auVar7);
  dVar9 = asin(auVar4._0_8_ * -2.0);
  __return_storage_ptr__->m_data[0] = dVar9;
  return __return_storage_ptr__;
}

Assistant:

ChVector<double> Q_to_NasaAngles(const ChQuaternion<double>& q1) {
    ChVector<double> mnasa;
    double sqw = q1.e0() * q1.e0();
    double sqx = q1.e1() * q1.e1();
    double sqy = q1.e2() * q1.e2();
    double sqz = q1.e3() * q1.e3();
    // heading
    mnasa.z() = atan2(2.0 * (q1.e1() * q1.e2() + q1.e3() * q1.e0()), (sqx - sqy - sqz + sqw));
    // bank
    mnasa.y() = atan2(2.0 * (q1.e2() * q1.e3() + q1.e1() * q1.e0()), (-sqx - sqy + sqz + sqw));
    // attitude
    mnasa.x() = asin(-2.0 * (q1.e1() * q1.e3() - q1.e2() * q1.e0()));
    return mnasa;
}